

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beagle.cpp
# Opt level: O2

int scoreFlags(long flags1,long flags2)

{
  int score;
  int iVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  bool bVar5;
  
  iVar2 = 1;
  iVar1 = 0;
  iVar4 = 0x20;
  while (bVar5 = iVar4 != 0, iVar4 = iVar4 + -1, bVar5) {
    uVar3 = (ulong)iVar2;
    iVar2 = iVar2 * 2;
    iVar1 = iVar1 + (uint)((uVar3 & flags2) != 0 && (uVar3 & flags1) != 0);
  }
  return -iVar1;
}

Assistant:

int scoreFlags(long flags1, long flags2) {
    int score = 0;
    int trait = 1;
    for(int bits=0; bits<32; bits++) {
        if ( (flags1 & trait) &&
             (flags2 & trait) )
            score++;
        trait <<= 1;
    }
    return -score;
}